

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

int nghttp2_map_remove(nghttp2_map *map,nghttp2_map_key_type key)

{
  nghttp2_map_key_type nVar1;
  uint32_t hash;
  nghttp2_map_bucket *pnVar2;
  size_t sVar3;
  nghttp2_map_bucket *pnVar4;
  ulong local_40;
  size_t d;
  nghttp2_map_bucket *bkt;
  size_t didx;
  size_t idx;
  uint32_t h;
  nghttp2_map_key_type key_local;
  nghttp2_map *map_local;
  
  hash = ::hash(key);
  didx = h2idx(hash,map->tablelenbits);
  for (local_40 = 0;
      (pnVar2 = map->table + didx, pnVar2->data != (void *)0x0 &&
      (sVar3 = distance(map->tablelen,map->tablelenbits,pnVar2,didx), local_40 <= sVar3));
      local_40 = local_40 + 1) {
    if (pnVar2->key == key) {
      map_bucket_set_data(pnVar2,0,0,(void *)0x0);
      bkt = (nghttp2_map_bucket *)didx;
      didx = didx + 1 & (ulong)(map->tablelen - 1);
      while ((pnVar2 = map->table + didx, pnVar2->data != (void *)0x0 &&
             (sVar3 = distance(map->tablelen,map->tablelenbits,pnVar2,didx), sVar3 != 0))) {
        pnVar4 = map->table + (long)bkt;
        nVar1 = pnVar2->key;
        pnVar4->hash = pnVar2->hash;
        pnVar4->key = nVar1;
        pnVar4->data = pnVar2->data;
        map_bucket_set_data(pnVar2,0,0,(void *)0x0);
        bkt = (nghttp2_map_bucket *)didx;
        didx = didx + 1 & (ulong)(map->tablelen - 1);
      }
      map->size = map->size - 1;
      return 0;
    }
    didx = didx + 1 & (ulong)(map->tablelen - 1);
  }
  return -0x1f5;
}

Assistant:

int nghttp2_map_remove(nghttp2_map *map, nghttp2_map_key_type key) {
  uint32_t h = hash(key);
  size_t idx = h2idx(h, map->tablelenbits), didx;
  nghttp2_map_bucket *bkt;
  size_t d = 0;

  for (;;) {
    bkt = &map->table[idx];

    if (bkt->data == NULL ||
        d > distance(map->tablelen, map->tablelenbits, bkt, idx)) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (bkt->key == key) {
      map_bucket_set_data(bkt, 0, 0, NULL);

      didx = idx;
      idx = (idx + 1) & (map->tablelen - 1);

      for (;;) {
        bkt = &map->table[idx];
        if (bkt->data == NULL ||
            distance(map->tablelen, map->tablelenbits, bkt, idx) == 0) {
          break;
        }

        map->table[didx] = *bkt;
        map_bucket_set_data(bkt, 0, 0, NULL);
        didx = idx;

        idx = (idx + 1) & (map->tablelen - 1);
      }

      --map->size;

      return 0;
    }

    ++d;
    idx = (idx + 1) & (map->tablelen - 1);
  }
}